

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

void PreEvaluate(Situation *situation)

{
  undefined4 uVar1;
  bool bVar2;
  undefined6 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  UINT8 *pUVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  char cVar17;
  char cVar22;
  char cVar23;
  char cVar25;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar26;
  ulong uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  ulong uVar30;
  undefined1 auVar31 [16];
  int attackless_pawn_value [256];
  int attacking_pawn_value [256];
  int local_838 [256];
  int local_438 [258];
  undefined1 auVar19 [16];
  undefined2 uVar24;
  
  iVar6 = 0;
  memset(local_438,0,0x400);
  memset(local_838,0,0x400);
  lVar11 = 0x10;
  iVar7 = 0;
  iVar14 = 0;
  iVar8 = 0;
  iVar5 = 0;
  iVar26 = 0;
  iVar16 = 0;
  bVar4 = true;
  do {
    bVar2 = bVar4;
    lVar11 = lVar11 + 0x104;
    lVar15 = 0;
    do {
      uVar9 = (uint)lVar15;
      if (uVar9 - 7 < 2) {
        if (situation->current_pieces[lVar15 + lVar11 + -0x104] != '\0') {
          iVar16 = iVar16 + 1;
          if (bVar2) {
            iVar8 = iVar8 + 1;
          }
          else {
            iVar14 = iVar14 + 1;
          }
        }
      }
      else if ((uVar9 < 0xb) && ((0x660U >> (uVar9 & 0x1f) & 1) != 0)) {
        if (situation->current_pieces[lVar15 + lVar11 + -0x104] != '\0') {
          iVar26 = iVar26 + 1;
          if (bVar2) {
            iVar7 = iVar7 + 1;
          }
          else {
            iVar6 = iVar6 + 1;
          }
        }
      }
      else {
        iVar5 = (iVar5 + 1) - (uint)(situation->current_pieces[lVar15 + lVar11 + -0x104] == '\0');
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    lVar11 = 0x20;
    bVar4 = false;
  } while (bVar2);
  iVar5 = iVar26 * 3 + iVar16 * 6 + iVar5;
  iVar5 = (0x84 - iVar5) * iVar5;
  iVar26 = iVar5 / 0x42;
  AdvancedValue = (iVar26 * 4 + 2) / 0x42;
  situation->UseBook = 0x103d < iVar5;
  iVar5 = 0x42 - iVar26;
  piVar12 = PiecesValue[1][5] + 0xfe;
  pUVar13 = "";
  lVar11 = 0;
  do {
    if (*pUVar13 != '\0') {
      iVar16 = (*(int *)((long)KING_PAWN_ENDGAME_ATTACKING_VALUE + lVar11) * iVar5 +
               *(int *)((long)KING_PAWN_MIDGAME_ATTACKING_VALUE + lVar11) * iVar26) / 0x42;
      piVar12[-0x500] = iVar16;
      *(int *)((long)PiecesValue[0][0] + lVar11) = iVar16;
      iVar16 = (*(int *)((long)HORSE_ENDGAME_VALUE + lVar11) * iVar5 +
               *(int *)((long)HORSE_MIDGAME_VALUE + lVar11) * iVar26) / 0x42;
      piVar12[-0x200] = iVar16;
      *(int *)((long)PiecesValue[0][3] + lVar11) = iVar16;
      iVar16 = (*(int *)((long)ROOK_ENDGAME_VALUE + lVar11) * iVar5 +
               *(int *)((long)ROOK_MIDGAME_VALUE + lVar11) * iVar26) / 0x42;
      piVar12[-0x100] = iVar16;
      *(int *)((long)PiecesValue[0][4] + lVar11) = iVar16;
      iVar16 = (*(int *)((long)CANNON_ENDGAME_VALUE + lVar11) * iVar5 +
               *(int *)((long)CANNON_MIDGAME_VALUE + lVar11) * iVar26) / 0x42;
      *piVar12 = iVar16;
      *(int *)((long)PiecesValue[0][5] + lVar11) = iVar16;
      *(undefined4 *)((long)local_438 + lVar11) = *(undefined4 *)((long)PiecesValue[0][0] + lVar11);
      *(int *)((long)local_838 + lVar11) =
           (*(int *)((long)KING_PAWN_ENDGAME_ATTACKLESS_VALUE + lVar11) * iVar5 +
           *(int *)((long)KING_PAWN_MIDGAME_ATTACKLESS_VALUE + lVar11) * iVar26) / 0x42;
    }
    piVar12 = piVar12 + -1;
    lVar11 = lVar11 + 4;
    pUVar13 = pUVar13 + 1;
  } while (lVar11 != 0x400);
  CentralThreat[0xc] = 0x1e;
  CentralThreat[0xd] = 0;
  CentralThreat[0xe] = 0;
  CentralThreat[0xf] = 0;
  CentralThreat[8] = 0x28;
  CentralThreat[9] = 0x23;
  CentralThreat[10] = 0x1e;
  CentralThreat[0xb] = 0x1e;
  CentralThreat[4] = 0;
  CentralThreat[5] = 0;
  CentralThreat[6] = 0x32;
  CentralThreat[7] = 0x2d;
  CentralThreat[0] = 0;
  CentralThreat[1] = 0;
  CentralThreat[2] = 0;
  CentralThreat[3] = 0;
  uVar9 = iVar26 + 0x42;
  lVar11 = 0;
  do {
    auVar21 = *(undefined1 (*) [16])((long)HOLLOW_THREAT_VALUE + lVar11);
    iVar26 = auVar21._4_4_;
    auVar29._4_4_ = iVar26;
    auVar29._0_4_ = iVar26;
    auVar29._8_4_ = auVar21._12_4_;
    auVar29._12_4_ = auVar21._12_4_;
    uVar10 = auVar21._0_4_ * uVar9;
    uVar27 = (auVar21._8_8_ & 0xffffffff) * (ulong)uVar9;
    uVar30 = (auVar29._8_8_ & 0xffffffff) * (ulong)uVar9;
    iVar5 = (int)((ulong)uVar10 * 0x3e0f83e1 >> 0x20) - (-(uint)((int)uVar10 < 0) & 0x3e0f83e1);
    iVar26 = (int)((ulong)(iVar26 * uVar9) * 0x3e0f83e1 >> 0x20) -
             (-(uint)((int)(iVar26 * uVar9) < 0) & 0x3e0f83e1);
    iVar16 = (int)((uVar27 & 0xffffffff) * 0x3e0f83e1 >> 0x20) -
             (-(uint)((int)uVar27 < 0) & 0x3e0f83e1);
    iVar28 = (int)((uVar30 & 0xffffffff) * 0x3e0f83e1 >> 0x20) -
             (-(uint)((int)uVar30 < 0) & 0x3e0f83e1);
    *(int *)((long)HollowThreat + lVar11) = (iVar5 >> 5) - (iVar5 >> 0x1f);
    *(int *)((long)HollowThreat + lVar11 + 4) = (iVar26 >> 5) - (iVar26 >> 0x1f);
    *(int *)((long)HollowThreat + lVar11 + 8) = (iVar16 >> 5) - (iVar16 >> 0x1f);
    *(int *)((long)HollowThreat + lVar11 + 0xc) = (iVar28 >> 5) - (iVar28 >> 0x1f);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  uVar1 = *(undefined4 *)(situation->current_pieces + 0x15);
  cVar17 = -('\0' < (char)uVar1);
  cVar22 = -('\0' < (char)((uint)uVar1 >> 8));
  cVar23 = -('\0' < (char)((uint)uVar1 >> 0x10));
  cVar25 = -('\0' < (char)((uint)uVar1 >> 0x18));
  uVar24 = CONCAT11(cVar25,cVar25);
  uVar1 = CONCAT31(CONCAT21(uVar24,cVar23),cVar23);
  uVar3 = CONCAT51(CONCAT41(uVar1,cVar22),cVar22);
  auVar20._0_2_ = CONCAT11(cVar17,cVar17);
  uVar27 = CONCAT62(uVar3,auVar20._0_2_);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar27;
  auVar19._12_2_ = uVar24;
  auVar19._14_2_ = uVar24;
  uVar24 = (undefined2)uVar1;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar27;
  auVar18._10_2_ = uVar24;
  auVar21._10_6_ = auVar18._10_6_;
  auVar21._8_2_ = uVar24;
  auVar21._0_8_ = uVar27;
  uVar24 = (undefined2)uVar3;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = uVar24;
  auVar20._4_2_ = uVar24;
  auVar20._2_2_ = auVar20._0_2_;
  auVar20 = auVar20 & _DAT_0010f6c0;
  uVar9 = auVar20._12_4_ * 2 + auVar20._4_4_ * 2 + auVar20._8_4_ * 2 + auVar20._0_4_ * 2;
  lVar11 = 0;
  do {
    uVar9 = uVar9 + ('\0' < (char)situation->current_pieces[lVar11 + 0x19]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 7);
  auVar21 = psadbw(ZEXT416(CONCAT22((ushort)((uint)*(undefined4 *)(situation->current_pieces + 0x25)
                                            >> 0x16),
                                    (ushort)*(undefined4 *)(situation->current_pieces + 0x25) >> 6)
                           & (uint)DAT_0010f6d0),(undefined1  [16])0x0);
  uVar10 = auVar21._0_4_;
  lVar11 = 0;
  do {
    uVar10 = uVar10 + (situation->current_pieces[lVar11 + 0x29] >> 7);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 7);
  iVar7 = iVar7 + iVar8 * 2;
  iVar6 = iVar6 + iVar14 * 2;
  if (iVar7 - iVar6 == 0 || iVar7 < iVar6) {
    uVar10 = uVar10 + (iVar6 - iVar7) * 2;
  }
  else {
    uVar9 = uVar9 + (iVar7 - iVar6) * 2;
  }
  if (7 < (int)uVar9) {
    uVar9 = 8;
  }
  if (7 < (int)uVar10) {
    uVar10 = 8;
  }
  BlackAdvisorLeakage = uVar9 * 10;
  RedAdvisorLeakage = uVar10 * 10;
  iVar7 = 8 - uVar10;
  iVar6 = 8 - uVar9;
  lVar11 = 0x3f8;
  pUVar13 = "";
  lVar15 = 0;
  do {
    if (*pUVar13 != '\0') {
      iVar8 = *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar15) * uVar10;
      iVar5 = *(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar15) * iVar7;
      iVar14 = iVar5 + iVar8;
      iVar5 = iVar5 + iVar8 + 7;
      if (-1 < iVar14) {
        iVar5 = iVar14;
      }
      *(int *)((long)PiecesValue[0][2] + lVar15) = iVar5 >> 3;
      *(int *)((long)PiecesValue[0][1] + lVar15) = iVar5 >> 3;
      iVar8 = *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar11) * uVar9;
      iVar5 = *(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar11) * iVar6;
      iVar14 = iVar5 + iVar8;
      iVar5 = iVar5 + iVar8 + 7;
      if (-1 < iVar14) {
        iVar5 = iVar14;
      }
      *(int *)((long)PiecesValue[1][2] + lVar15) = iVar5 >> 3;
      *(int *)((long)PiecesValue[1][1] + lVar15) = iVar5 >> 3;
      iVar8 = *(int *)((long)local_438 + lVar15) * uVar9;
      iVar5 = *(int *)((long)local_838 + lVar15) * iVar6;
      iVar14 = iVar5 + iVar8;
      iVar5 = iVar5 + iVar8 + 7;
      if (-1 < iVar14) {
        iVar5 = iVar14;
      }
      *(int *)((long)PiecesValue[0][6] + lVar15) = iVar5 >> 3;
      iVar8 = *(int *)((long)local_438 + lVar11) * uVar10;
      iVar5 = *(int *)((long)local_838 + lVar11) * iVar7;
      iVar14 = iVar5 + iVar8;
      iVar5 = iVar5 + iVar8 + 7;
      if (-1 < iVar14) {
        iVar5 = iVar14;
      }
      *(int *)((long)PiecesValue[1][6] + lVar15) = iVar5 >> 3;
    }
    lVar11 = lVar11 + -4;
    lVar15 = lVar15 + 4;
    pUVar13 = pUVar13 + 1;
  } while (lVar15 != 0x400);
  lVar11 = 0;
  do {
    auVar21 = *(undefined1 (*) [16])((long)BOTTOM_THREAT + lVar11);
    iVar5 = auVar21._0_4_ * uVar10;
    iVar8 = (int)((auVar21._8_8_ & 0xffffffff) * (ulong)uVar10);
    iVar14 = auVar21._4_4_;
    auVar31._4_4_ = iVar14;
    auVar31._0_4_ = iVar14;
    auVar31._8_4_ = auVar21._12_4_;
    auVar31._12_4_ = auVar21._12_4_;
    iVar26 = (int)((auVar31._8_8_ & 0xffffffff) * (ulong)uVar10);
    *(int *)((long)RedBottomThreat + lVar11) = (int)(((uint)(iVar5 >> 0x1f) >> 0x1d) + iVar5) >> 3;
    *(int *)((long)RedBottomThreat + lVar11 + 4) =
         (int)(((uint)((int)(iVar14 * uVar10) >> 0x1f) >> 0x1d) + iVar14 * uVar10) >> 3;
    *(int *)((long)RedBottomThreat + lVar11 + 8) =
         (int)(((uint)(iVar8 >> 0x1f) >> 0x1d) + iVar8) >> 3;
    *(int *)((long)RedBottomThreat + lVar11 + 0xc) =
         (int)(((uint)(iVar26 >> 0x1f) >> 0x1d) + iVar26) >> 3;
    iVar5 = auVar21._0_4_ * uVar9;
    iVar8 = (int)((auVar21._8_8_ & 0xffffffff) * (ulong)uVar9);
    iVar26 = (int)((auVar31._8_8_ & 0xffffffff) * (ulong)uVar9);
    *(int *)((long)BlackBottomThreat + lVar11) = (int)(((uint)(iVar5 >> 0x1f) >> 0x1d) + iVar5) >> 3
    ;
    *(int *)((long)BlackBottomThreat + lVar11 + 4) =
         (int)(((uint)((int)(iVar14 * uVar9) >> 0x1f) >> 0x1d) + iVar14 * uVar9) >> 3;
    *(int *)((long)BlackBottomThreat + lVar11 + 8) =
         (int)(((uint)(iVar8 >> 0x1f) >> 0x1d) + iVar8) >> 3;
    *(int *)((long)BlackBottomThreat + lVar11 + 0xc) =
         (int)(((uint)(iVar26 >> 0x1f) >> 0x1d) + iVar26) >> 3;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  iVar7 = iVar7 * 10;
  lVar11 = 0;
  do {
    if ((ulong)situation->current_pieces[lVar11 + 0x10] != 0) {
      iVar7 = iVar7 + PiecesValue[0][PIECE_NUM_TO_TYPE[lVar11 + 0x10]]
                      [situation->current_pieces[lVar11 + 0x10]];
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  iVar6 = iVar6 * 10;
  lVar11 = 0;
  do {
    if ((ulong)situation->current_pieces[lVar11 + 0x20] != 0) {
      iVar6 = iVar6 + *(int *)((long)PIECE_NUM_TO_TYPE[lVar11 + 0x20] * 0x400 + 0x3455d0 +
                              (ulong)situation->current_pieces[lVar11 + 0x20] * 4);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  situation->value[0] = iVar7;
  situation->value[1] = iVar6;
  return;
}

Assistant:

void PreEvaluate(Situation &situation)
{
    int side_tag;                             //用于标志行走方
    int black_value = 0, red_value = 0;       //记录价值
    int red_attacks = 0, black_attacks = 0;   //双方威胁值
    int red_simple_value, black_simple_value; //双方轻子价值
    int midgame_value = 0;
    int attacking_pawn_value[256] = {0}, attackless_pawn_value[256] = {0};

    //首先判断局势处于开中局还是残局阶段，方法是计算各种棋子的数量，按照车=6、马炮=3、其它=1相加。
    //统计三类棋子数量
    int rook_nums = 0, horse_cannon_nums = 0, others_nums = 0;
    int red_rook_nums = 0, black_rook_nums = 0, red_horse_cannon_nums = 0, black_horsecannon_nums = 0;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        for (int i = 0; i < 16; i++)
        {
            if (i == 7 || i == 8) //车
            {
                if (situation.current_pieces[side_tag + i])
                {
                    rook_nums++;
                    if (r == 0)
                        red_rook_nums++;
                    else
                        black_rook_nums++;
                }
            }
            else if (i == 5 || i == 6 || i == 9 || i == 10) //马炮
            {
                if (situation.current_pieces[side_tag + i])
                {
                    horse_cannon_nums++;
                    if (r == 0)
                        red_horse_cannon_nums++;
                    else
                        black_horsecannon_nums++;
                }
            }
            else
            {
                if (situation.current_pieces[side_tag + i])
                    others_nums++;
            }
        }
    }
    midgame_value += rook_nums * ROOK_VALUE;
    midgame_value += horse_cannon_nums * HORSE_CANNON_VALUE;
    midgame_value += others_nums * OTHER_VALUE;
    //使用二次函数，子力很少时才认为接近残局
    midgame_value = (2 * TOTAL_MIDGAME_VALUE - midgame_value) * midgame_value / TOTAL_MIDGAME_VALUE;
    AdvancedValue = (TOTAL_AdvancedValue * midgame_value + TOTAL_AdvancedValue / 2) / TOTAL_MIDGAME_VALUE;
    situation.UseBook = midgame_value > 62;
    //计算将车马炮的价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][0][i] = PiecesValue[BLACK][0][254 - i] = ((KING_PAWN_MIDGAME_ATTACKING_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKING_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][3][i] = PiecesValue[BLACK][3][254 - i] = ((HORSE_MIDGAME_VALUE[i] * midgame_value + HORSE_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][4][i] = PiecesValue[BLACK][4][254 - i] = ((ROOK_MIDGAME_VALUE[i] * midgame_value + ROOK_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][5][i] = PiecesValue[BLACK][5][254 - i] = ((CANNON_MIDGAME_VALUE[i] * midgame_value + CANNON_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            attacking_pawn_value[i] = PiecesValue[RED][0][i];
            attackless_pawn_value[i] = ((KING_PAWN_MIDGAME_ATTACKLESS_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKLESS_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
        }
    }

    //计算空头炮和中炮威胁值
    for (int i = 0; i < 16; i++)
    {
        HollowThreat[i] = HOLLOW_THREAT_VALUE[i] * (midgame_value + TOTAL_MIDGAME_VALUE) / (TOTAL_MIDGAME_VALUE * 2);
        CentralThreat[i] = CENTRAL_THREAT_VALUE[i];
    }

    //然后判断各方是否处于进攻状态，方法是计算各种过河棋子的数量，按照车马2炮兵1相加。
    for (int i = 16 + 5; i <= 16 + 8; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks += 2;
    }
    for (int i = 16 + 9; i <= 16 + 15; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks++;
    }
    for (int i = 32 + 5; i <= 32 + 8; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks += 2;
    }
    for (int i = 32 + 9; i <= 32 + 15; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks++;
    }

    //如果本方轻子数比对方多，那么每多一个轻子(车算2个轻子)威胁值加2。威胁值最多不超过8。
    red_simple_value = red_rook_nums * 2 + red_horse_cannon_nums;
    black_simple_value = black_rook_nums * 2 + black_horsecannon_nums;
    if (red_simple_value > black_simple_value)
    {
        red_attacks += (red_simple_value - black_simple_value) * 2;
    }
    else
    {
        black_attacks += (black_simple_value - red_simple_value) * 2;
    }
    red_attacks = std::min(red_attacks, TOTAL_ATTACK_VALUE);
    black_attacks = std::min(black_attacks, TOTAL_ATTACK_VALUE);

    //计算士的缺值
    BlackAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * red_attacks / TOTAL_ATTACK_VALUE;
    RedAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * black_attacks / TOTAL_ATTACK_VALUE;

    //计算士象兵价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][1][i] = PiecesValue[RED][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[i] * black_attacks +
                                                                THREATLESS_ADVISOR_BISHOP_VALUE[i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                                               TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][1][i] = PiecesValue[BLACK][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[254 - i] * red_attacks +
                                                                    THREATLESS_ADVISOR_BISHOP_VALUE[254 - i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                                                   TOTAL_ATTACK_VALUE);
            PiecesValue[RED][6][i] = ((attacking_pawn_value[i] * red_attacks +
                                       attackless_pawn_value[i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                      TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][6][i] = ((attacking_pawn_value[254 - i] * black_attacks +
                                         attackless_pawn_value[254 - i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                        TOTAL_ATTACK_VALUE);
        }
    }

    //计算沉底炮威胁值
    for (int i = 0; i < 16; i++)
    {
        RedBottomThreat[i] = BOTTOM_THREAT[i] * black_attacks / TOTAL_ATTACK_VALUE;
        BlackBottomThreat[i] = BOTTOM_THREAT[i] * red_attacks / TOTAL_ATTACK_VALUE;
    }

    // 调整不受威胁方少掉的仕(士)相(象)分值
    red_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - black_attacks) / TOTAL_ATTACK_VALUE;
    black_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - red_attacks) / TOTAL_ATTACK_VALUE;
    // 最后重新计算子力位置分
    for (int i = 16; i < 32; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            red_value += PiecesValue[RED][PIECE_NUM_TO_TYPE[i]][pos];
    }
    for (int i = 32; i < 48; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            black_value += PiecesValue[BLACK][PIECE_NUM_TO_TYPE[i]][pos];
    }

    situation.value[RED] = red_value;
    situation.value[BLACK] = black_value;
}